

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O1

void __thiscall
inject::circular_dependency::circular_dependency(circular_dependency *this,unique_id component)

{
  stringstream oss;
  long *local_1c0 [2];
  long local_1b0 [2];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  *(undefined ***)this = &PTR__circular_dependency_0010f8f8;
  this->_component = component;
  (this->_msg)._M_dataplus._M_p = (pointer)&(this->_msg).field_2;
  (this->_msg)._M_string_length = 0;
  (this->_msg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"circular dependency detected in component ",0x2a);
  std::ostream::_M_insert<long>((long)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_msg,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

circular_dependency(unique_id component) throw() :
            exception(), _component(component) {
        std::stringstream oss;
        oss << "circular dependency detected in component " << component;
        _msg = oss.str();
    }